

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCreateTestSourceList.cxx
# Opt level: O2

bool __thiscall
cmCreateTestSourceList::InitialPass
          (cmCreateTestSourceList *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *param_2)

{
  char *__s;
  cmMakefile *pcVar1;
  size_type sVar2;
  pointer pbVar3;
  bool bVar4;
  int iVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar6;
  string *psVar7;
  cmSourceFile *pcVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar9;
  string sourceListValue;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c0;
  string functionMapCode;
  string driver;
  cmNewLineStyle local_154;
  string *local_150;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  tests;
  string extraInclude;
  string local_108;
  string configFile;
  string forwardDeclareCode;
  string function;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  tests_func_name;
  string local_70;
  string local_50;
  
  pbVar9 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pbVar6 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if ((ulong)((long)pbVar6 - (long)pbVar9) < 0x41) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&extraInclude,"called with wrong number of arguments.",
               (allocator<char> *)&function);
    cmCommand::SetError(&this->super_cmCommand,&extraInclude);
    std::__cxx11::string::~string((string *)&extraInclude);
    bVar4 = false;
  }
  else {
    extraInclude._M_dataplus._M_p = (pointer)&extraInclude.field_2;
    extraInclude._M_string_length = 0;
    function._M_dataplus._M_p = (pointer)&function.field_2;
    function._M_string_length = 0;
    extraInclude.field_2._M_local_buf[0] = '\0';
    function.field_2._M_local_buf[0] = '\0';
    tests.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    tests.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    tests.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    for (; pbVar3 = tests.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start, pbVar9 != pbVar6; pbVar9 = pbVar9 + 1
        ) {
      bVar4 = std::operator==(pbVar9,"EXTRA_INCLUDE");
      if (bVar4) {
        pbVar9 = pbVar9 + 1;
        if (pbVar9 == (args->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&driver,"incorrect arguments to EXTRA_INCLUDE",
                     (allocator<char> *)&configFile);
          cmCommand::SetError(&this->super_cmCommand,&driver);
          goto LAB_0016ccf6;
        }
        std::__cxx11::string::assign((char *)&extraInclude);
        std::__cxx11::string::append((string *)&extraInclude);
        std::__cxx11::string::append((char *)&extraInclude);
      }
      else {
        bVar4 = std::operator==(pbVar9,"FUNCTION");
        if (bVar4) {
          pbVar9 = pbVar9 + 1;
          if (pbVar9 == (args->
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_finish) {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&driver,"incorrect arguments to FUNCTION",
                       (allocator<char> *)&configFile);
            cmCommand::SetError(&this->super_cmCommand,&driver);
            goto LAB_0016ccf6;
          }
          std::__cxx11::string::_M_assign((string *)&function);
          std::__cxx11::string::append((char *)&function);
        }
        else {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(&tests,pbVar9);
        }
      }
      pbVar6 = (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
    }
    __s = ((tests.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p;
    cmsys::SystemTools::GetFilenameExtension
              (&driver,tests.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + 1);
    std::__cxx11::string::~string((string *)&driver);
    if (driver._M_string_length < 2) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&driver,"You must specify a file extension for the test driver file.",
                 (allocator<char> *)&configFile);
      cmCommand::SetError(&this->super_cmCommand,&driver);
LAB_0016ccf6:
      std::__cxx11::string::~string((string *)&driver);
      bVar4 = false;
    }
    else {
      psVar7 = cmMakefile::GetCurrentBinaryDirectory_abi_cxx11_((this->super_cmCommand).Makefile);
      std::__cxx11::string::string((string *)&driver,(string *)psVar7);
      std::__cxx11::string::append((char *)&driver);
      std::__cxx11::string::append((string *)&driver);
      psVar7 = cmSystemTools::GetCMakeRoot_abi_cxx11_();
      std::__cxx11::string::string((string *)&configFile,(string *)psVar7);
      std::__cxx11::string::append((char *)&configFile);
      tests_func_name.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      forwardDeclareCode._M_dataplus._M_p = (pointer)&forwardDeclareCode.field_2;
      forwardDeclareCode._M_string_length = 0;
      tests_func_name.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      tests_func_name.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      forwardDeclareCode.field_2._M_local_buf[0] = '\0';
      pbVar9 = pbVar3 + 2;
      local_150 = pbVar9;
      for (; psVar7 = &sourceListValue,
          pbVar9 != tests.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish; pbVar9 = pbVar9 + 1) {
        bVar4 = std::operator==(pbVar9,"EXTRA_INCLUDE");
        if (bVar4) break;
        functionMapCode._M_dataplus._M_p = (pointer)&functionMapCode.field_2;
        functionMapCode._M_string_length = 0;
        functionMapCode.field_2._M_local_buf[0] = '\0';
        cmsys::SystemTools::GetFilenamePath(psVar7,pbVar9);
        sVar2 = sourceListValue._M_string_length;
        std::__cxx11::string::~string((string *)psVar7);
        if (sVar2 == 0) {
          cmsys::SystemTools::GetFilenameWithoutLastExtension(psVar7,pbVar9);
          std::__cxx11::string::operator=((string *)&functionMapCode,(string *)psVar7);
        }
        else {
          psVar7 = &local_108;
          cmsys::SystemTools::GetFilenamePath(psVar7,pbVar9);
          std::operator+(&local_1c0,psVar7,"/");
          cmsys::SystemTools::GetFilenameWithoutLastExtension(&local_70,pbVar9);
          std::operator+(&sourceListValue,&local_1c0,&local_70);
          std::__cxx11::string::operator=((string *)&functionMapCode,(string *)&sourceListValue);
          std::__cxx11::string::~string((string *)&sourceListValue);
          std::__cxx11::string::~string((string *)&local_70);
          std::__cxx11::string::~string((string *)&local_1c0);
        }
        std::__cxx11::string::~string((string *)psVar7);
        cmsys::SystemTools::ConvertToUnixSlashes(&functionMapCode);
        sourceListValue._M_dataplus._M_p._0_1_ = 0x20;
        local_1c0._M_dataplus._M_p._0_1_ = 0x5f;
        std::replace<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,char>
                  ((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    )functionMapCode._M_dataplus._M_p,
                   (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    )(functionMapCode._M_dataplus._M_p + functionMapCode._M_string_length),
                   (char *)&sourceListValue,(char *)&local_1c0);
        sourceListValue._M_dataplus._M_p._0_1_ = 0x2f;
        local_1c0._M_dataplus._M_p._0_1_ = 0x5f;
        std::replace<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,char>
                  ((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    )functionMapCode._M_dataplus._M_p,
                   (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    )(functionMapCode._M_dataplus._M_p + functionMapCode._M_string_length),
                   (char *)&sourceListValue,(char *)&local_1c0);
        sourceListValue._M_dataplus._M_p._0_1_ = 0x3a;
        local_1c0._M_dataplus._M_p._0_1_ = 0x5f;
        std::replace<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,char>
                  ((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    )functionMapCode._M_dataplus._M_p,
                   (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    )(functionMapCode._M_dataplus._M_p + functionMapCode._M_string_length),
                   (char *)&sourceListValue,(char *)&local_1c0);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&tests_func_name,&functionMapCode);
        std::__cxx11::string::append((char *)&forwardDeclareCode);
        std::__cxx11::string::append((string *)&forwardDeclareCode);
        std::__cxx11::string::append((char *)&forwardDeclareCode);
        std::__cxx11::string::~string((string *)&functionMapCode);
      }
      functionMapCode._M_dataplus._M_p = (pointer)&functionMapCode.field_2;
      functionMapCode._M_string_length = 0;
      functionMapCode.field_2._M_local_buf[0] = '\0';
      for (psVar7 = local_150;
          psVar7 != tests.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish; psVar7 = psVar7 + 1) {
        sourceListValue._M_dataplus._M_p = (pointer)&sourceListValue.field_2;
        sourceListValue._M_string_length = 0;
        sourceListValue.field_2._M_local_buf[0] = '\0';
        cmsys::SystemTools::GetFilenamePath(&local_1c0,psVar7);
        sVar2 = local_1c0._M_string_length;
        std::__cxx11::string::~string((string *)&local_1c0);
        if (sVar2 == 0) {
          cmsys::SystemTools::GetFilenameWithoutLastExtension(&local_1c0,psVar7);
          std::__cxx11::string::operator=((string *)&sourceListValue,(string *)&local_1c0);
          std::__cxx11::string::~string((string *)&local_1c0);
        }
        else {
          cmsys::SystemTools::GetFilenamePath(&local_70,psVar7);
          std::operator+(&local_108,&local_70,"/");
          cmsys::SystemTools::GetFilenameWithoutLastExtension(&local_50,psVar7);
          std::operator+(&local_1c0,&local_108,&local_50);
          std::__cxx11::string::operator=((string *)&sourceListValue,(string *)&local_1c0);
          std::__cxx11::string::~string((string *)&local_1c0);
          std::__cxx11::string::~string((string *)&local_50);
          std::__cxx11::string::~string((string *)&local_108);
          std::__cxx11::string::~string((string *)&local_70);
        }
        std::__cxx11::string::append((char *)&functionMapCode);
        std::__cxx11::string::append((string *)&functionMapCode);
        std::__cxx11::string::append((char *)&functionMapCode);
        std::__cxx11::string::append((string *)&functionMapCode);
        std::__cxx11::string::append((char *)&functionMapCode);
        std::__cxx11::string::~string((string *)&sourceListValue);
      }
      if (extraInclude._M_string_length != 0) {
        pcVar1 = (this->super_cmCommand).Makefile;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&sourceListValue,"CMAKE_TESTDRIVER_EXTRA_INCLUDES",
                   (allocator<char> *)&local_1c0);
        cmMakefile::AddDefinition(pcVar1,&sourceListValue,extraInclude._M_dataplus._M_p);
        std::__cxx11::string::~string((string *)&sourceListValue);
      }
      if (function._M_string_length != 0) {
        pcVar1 = (this->super_cmCommand).Makefile;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&sourceListValue,"CMAKE_TESTDRIVER_ARGVC_FUNCTION",
                   (allocator<char> *)&local_1c0);
        cmMakefile::AddDefinition(pcVar1,&sourceListValue,function._M_dataplus._M_p);
        std::__cxx11::string::~string((string *)&sourceListValue);
      }
      pcVar1 = (this->super_cmCommand).Makefile;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&sourceListValue,"CMAKE_FORWARD_DECLARE_TESTS",
                 (allocator<char> *)&local_1c0);
      cmMakefile::AddDefinition(pcVar1,&sourceListValue,forwardDeclareCode._M_dataplus._M_p);
      std::__cxx11::string::~string((string *)&sourceListValue);
      pcVar1 = (this->super_cmCommand).Makefile;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&sourceListValue,"CMAKE_FUNCTION_TABLE_ENTIRES",
                 (allocator<char> *)&local_1c0);
      cmMakefile::AddDefinition(pcVar1,&sourceListValue,functionMapCode._M_dataplus._M_p);
      std::__cxx11::string::~string((string *)&sourceListValue);
      pcVar1 = (this->super_cmCommand).Makefile;
      cmNewLineStyle::cmNewLineStyle(&local_154);
      iVar5 = cmMakefile::ConfigureFile(pcVar1,&configFile,&driver,false,true,false,local_154);
      bVar4 = iVar5 != 0;
      sourceListValue._M_dataplus._M_p = (pointer)&sourceListValue.field_2;
      sourceListValue._M_string_length = 0;
      sourceListValue.field_2._M_local_buf[0] = '\0';
      pcVar8 = cmMakefile::GetOrCreateSource
                         ((this->super_cmCommand).Makefile,&driver,false,Ambiguous);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1c0,"ABSTRACT",(allocator<char> *)&local_108);
      cmSourceFile::SetProperty(pcVar8,&local_1c0,"0");
      std::__cxx11::string::~string((string *)&local_1c0);
      std::__cxx11::string::_M_assign((string *)&sourceListValue);
      for (psVar7 = local_150; pcVar1 = (this->super_cmCommand).Makefile,
          psVar7 != tests.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish; psVar7 = psVar7 + 1) {
        pcVar8 = cmMakefile::GetOrCreateSource(pcVar1,psVar7,false,Ambiguous);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1c0,"ABSTRACT",(allocator<char> *)&local_108);
        cmSourceFile::SetProperty(pcVar8,&local_1c0,"0");
        std::__cxx11::string::~string((string *)&local_1c0);
        std::__cxx11::string::append((char *)&sourceListValue);
        std::__cxx11::string::append((string *)&sourceListValue);
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1c0,__s,(allocator<char> *)&local_108);
      cmMakefile::AddDefinition(pcVar1,&local_1c0,sourceListValue._M_dataplus._M_p);
      std::__cxx11::string::~string((string *)&local_1c0);
      std::__cxx11::string::~string((string *)&sourceListValue);
      std::__cxx11::string::~string((string *)&functionMapCode);
      std::__cxx11::string::~string((string *)&forwardDeclareCode);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&tests_func_name);
      std::__cxx11::string::~string((string *)&configFile);
      std::__cxx11::string::~string((string *)&driver);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&tests);
    std::__cxx11::string::~string((string *)&function);
    std::__cxx11::string::~string((string *)&extraInclude);
  }
  return bVar4;
}

Assistant:

bool cmCreateTestSourceList::InitialPass(std::vector<std::string> const& args,
                                         cmExecutionStatus&)
{
  if (args.size() < 3) {
    this->SetError("called with wrong number of arguments.");
    return false;
  }

  std::vector<std::string>::const_iterator i = args.begin();
  std::string extraInclude;
  std::string function;
  std::vector<std::string> tests;
  // extract extra include and function ot
  for (; i != args.end(); i++) {
    if (*i == "EXTRA_INCLUDE") {
      ++i;
      if (i == args.end()) {
        this->SetError("incorrect arguments to EXTRA_INCLUDE");
        return false;
      }
      extraInclude = "#include \"";
      extraInclude += *i;
      extraInclude += "\"\n";
    } else if (*i == "FUNCTION") {
      ++i;
      if (i == args.end()) {
        this->SetError("incorrect arguments to FUNCTION");
        return false;
      }
      function = *i;
      function += "(&ac, &av);\n";
    } else {
      tests.push_back(*i);
    }
  }
  i = tests.begin();

  // Name of the source list

  const char* sourceList = i->c_str();
  ++i;

  // Name of the test driver
  // make sure they specified an extension
  if (cmSystemTools::GetFilenameExtension(*i).size() < 2) {
    this->SetError(
      "You must specify a file extension for the test driver file.");
    return false;
  }
  std::string driver = this->Makefile->GetCurrentBinaryDirectory();
  driver += "/";
  driver += *i;
  ++i;

  std::string configFile = cmSystemTools::GetCMakeRoot();

  configFile += "/Templates/TestDriver.cxx.in";
  // Create the test driver file

  std::vector<std::string>::const_iterator testsBegin = i;
  std::vector<std::string> tests_func_name;

  // The rest of the arguments consist of a list of test source files.
  // Sadly, they can be in directories. Let's find a unique function
  // name for the corresponding test, and push it to the tests_func_name
  // list.
  // For the moment:
  //   - replace spaces ' ', ':' and '/' with underscores '_'
  std::string forwardDeclareCode;
  for (i = testsBegin; i != tests.end(); ++i) {
    if (*i == "EXTRA_INCLUDE") {
      break;
    }
    std::string func_name;
    if (!cmSystemTools::GetFilenamePath(*i).empty()) {
      func_name = cmSystemTools::GetFilenamePath(*i) + "/" +
        cmSystemTools::GetFilenameWithoutLastExtension(*i);
    } else {
      func_name = cmSystemTools::GetFilenameWithoutLastExtension(*i);
    }
    cmSystemTools::ConvertToUnixSlashes(func_name);
    std::replace(func_name.begin(), func_name.end(), ' ', '_');
    std::replace(func_name.begin(), func_name.end(), '/', '_');
    std::replace(func_name.begin(), func_name.end(), ':', '_');
    tests_func_name.push_back(func_name);
    forwardDeclareCode += "int ";
    forwardDeclareCode += func_name;
    forwardDeclareCode += "(int, char*[]);\n";
  }

  std::string functionMapCode;
  int numTests = 0;
  std::vector<std::string>::iterator j;
  for (i = testsBegin, j = tests_func_name.begin(); i != tests.end();
       ++i, ++j) {
    std::string func_name;
    if (!cmSystemTools::GetFilenamePath(*i).empty()) {
      func_name = cmSystemTools::GetFilenamePath(*i) + "/" +
        cmSystemTools::GetFilenameWithoutLastExtension(*i);
    } else {
      func_name = cmSystemTools::GetFilenameWithoutLastExtension(*i);
    }
    functionMapCode += "  {\n"
                       "    \"";
    functionMapCode += func_name;
    functionMapCode += "\",\n"
                       "    ";
    functionMapCode += *j;
    functionMapCode += "\n"
                       "  },\n";
    numTests++;
  }
  if (!extraInclude.empty()) {
    this->Makefile->AddDefinition("CMAKE_TESTDRIVER_EXTRA_INCLUDES",
                                  extraInclude.c_str());
  }
  if (!function.empty()) {
    this->Makefile->AddDefinition("CMAKE_TESTDRIVER_ARGVC_FUNCTION",
                                  function.c_str());
  }
  this->Makefile->AddDefinition("CMAKE_FORWARD_DECLARE_TESTS",
                                forwardDeclareCode.c_str());
  this->Makefile->AddDefinition("CMAKE_FUNCTION_TABLE_ENTIRES",
                                functionMapCode.c_str());
  bool res = true;
  if (!this->Makefile->ConfigureFile(configFile, driver, false, true, false)) {
    res = false;
  }

  // Construct the source list.
  std::string sourceListValue;
  {
    cmSourceFile* sf = this->Makefile->GetOrCreateSource(driver);
    sf->SetProperty("ABSTRACT", "0");
    sourceListValue = args[1];
  }
  for (i = testsBegin; i != tests.end(); ++i) {
    cmSourceFile* sf = this->Makefile->GetOrCreateSource(*i);
    sf->SetProperty("ABSTRACT", "0");
    sourceListValue += ";";
    sourceListValue += *i;
  }

  this->Makefile->AddDefinition(sourceList, sourceListValue.c_str());
  return res;
}